

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_op_gobble_right(char *expr,int *pos,matd_t *acc,matd_t **garb,int *garbpos)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  do {
    lVar3 = (long)*pos;
    if (expr[lVar3] == '^') {
      if (acc == (matd_t *)0x0) {
        __assert_fail("acc != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x23a,
                      "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)"
                     );
      }
      if (expr[lVar3 + 1] != '-') {
        __assert_fail("expr[*pos+1] == \'-\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x23b,
                      "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)"
                     );
      }
      if (expr[lVar3 + 2] != '1') {
        __assert_fail("expr[*pos+2] == \'1\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x23c,
                      "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)"
                     );
      }
      acc = matd_inverse(acc);
      iVar2 = 3;
    }
    else {
      if (expr[lVar3] != '\'') {
        return acc;
      }
      if (acc == (matd_t *)0x0) {
        __assert_fail("acc != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x22e,
                      "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)"
                     );
      }
      acc = matd_transpose(acc);
      iVar2 = 1;
    }
    iVar1 = *garbpos;
    garb[iVar1] = acc;
    *garbpos = iVar1 + 1;
    *pos = *pos + iVar2;
  } while( true );
}

Assistant:

static inline matd_t *matd_op_gobble_right(const char *expr, int *pos, matd_t *acc, matd_t **garb, int *garbpos)
{
    while (expr[*pos] != 0) {

        switch (expr[*pos]) {

            case '\'': {
                assert(acc != NULL); // either a syntax error or a math op failed, producing null
                matd_t *res = matd_transpose(acc);
                garb[*garbpos] = res;
                (*garbpos)++;
                acc = res;

                (*pos)++;
                break;
            }

                // handle inverse ^-1. No other exponents are allowed.
            case '^': {
                assert(acc != NULL);
                assert(expr[*pos+1] == '-');
                assert(expr[*pos+2] == '1');

                matd_t *res = matd_inverse(acc);
                garb[*garbpos] = res;
                (*garbpos)++;
                acc = res;

                (*pos)+=3;
                break;
            }

            default:
                return acc;
        }
    }

    return acc;
}